

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::EnumGenerator::Generate(EnumGenerator *this,Printer *printer)

{
  bool bVar1;
  pointer ppEVar2;
  pointer pAVar3;
  int i;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  string constant_name;
  string classname;
  string local_98;
  string local_78;
  ulong local_58;
  string local_50;
  
  io::Printer::Print(printer,"\n// enum $classname$\n","classname",*(string **)this->descriptor_);
  RenameJavaKeywords(&local_50,*(string **)this->descriptor_);
  uVar6 = (ulong)this->params_->generate_intdefs_;
  bVar1 = this->params_->java_enum_style_;
  if (uVar6 == 1) {
    io::Printer::Print(printer,
                       "@java.lang.annotation.Retention(java.lang.annotation.RetentionPolicy.SOURCE)\n@android.support.annotation.IntDef({\n"
                      );
    io::Printer::Indent(printer);
    ppEVar2 = (this->canonical_values_).
              super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_58 = uVar6;
    if ((this->canonical_values_).
        super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppEVar2) {
      uVar6 = 0;
      do {
        RenameJavaKeywords(&local_98,*(string **)ppEVar2[uVar6]);
        if (bVar1 == false) {
          io::Printer::Print(printer,"$name$,\n","name",&local_98);
        }
        else {
          io::Printer::Print(printer,"$classname$.$name$,\n","classname",&local_50,"name",&local_98)
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        uVar6 = uVar6 + 1;
        ppEVar2 = (this->canonical_values_).
                  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)((long)(this->canonical_values_).
                                     super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3
                              ));
    }
    io::Printer::Outdent(printer);
    uVar6 = local_58;
    io::Printer::Print(printer,"})\n");
  }
  if ((byte)((byte)uVar6 | bVar1) == 1) {
    pcVar5 = "";
    if (uVar6 != 0) {
      pcVar5 = "@";
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,pcVar5,pcVar5 + uVar6);
    io::Printer::Print(printer,"public $at_for_intdef$interface $classname$ {\n","classname",
                       &local_50,"at_for_intdef",&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (bVar1 == false) {
      io::Printer::Print(printer,"}\n\n");
    }
    else {
      io::Printer::Indent(printer);
    }
  }
  ppEVar2 = (this->canonical_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->canonical_values_).
      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppEVar2) {
    uVar6 = 0;
    do {
      RenameJavaKeywords(&local_98,*(string **)ppEVar2[uVar6]);
      SimpleItoa_abi_cxx11_
                (&local_78,
                 (protobuf *)
                 (ulong)*(uint *)((this->canonical_values_).
                                  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar6] + 0x10),i);
      io::Printer::Print(printer,"public static final int $name$ = $canonical_value$;\n","name",
                         &local_98,"canonical_value",&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      uVar6 = uVar6 + 1;
      ppEVar2 = (this->canonical_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->canonical_values_).
                                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3))
    ;
  }
  pAVar3 = (this->aliases_).
           super__Vector_base<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->aliases_).
      super__Vector_base<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar3) {
    lVar4 = 0;
    uVar6 = 0;
    do {
      RenameJavaKeywords(&local_98,(string *)**(undefined8 **)((long)&pAVar3->value + lVar4));
      RenameJavaKeywords(&local_78,
                         (string *)
                         **(undefined8 **)
                           ((long)&((this->aliases_).
                                    super__Vector_base<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->canonical_value +
                           lVar4));
      io::Printer::Print(printer,"public static final int $name$ = $canonical_name$;\n","name",
                         &local_98,"canonical_name",&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      uVar6 = uVar6 + 1;
      pAVar3 = (this->aliases_).
               super__Vector_base<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x10;
    } while (uVar6 < (ulong)((long)(this->aliases_).
                                   super__Vector_base<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar3 >> 4));
  }
  if (bVar1 != false) {
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void EnumGenerator::Generate(io::Printer* printer) {
  printer->Print(
      "\n"
      "// enum $classname$\n",
      "classname", descriptor_->name());

  const string classname = RenameJavaKeywords(descriptor_->name());

  // Start of container interface
  // If generating intdefs, we use the container interface as the intdef if
  // present. Otherwise, we just make an empty @interface parallel to the
  // constants.
  bool use_intdef = params_.generate_intdefs();
  bool use_shell_class = params_.java_enum_style();
  if (use_intdef) {
    // @IntDef annotation so tools can enforce correctness
    // Annotations will be discarded by the compiler
    printer->Print("@java.lang.annotation.Retention("
      "java.lang.annotation.RetentionPolicy.SOURCE)\n"
      "@android.support.annotation.IntDef({\n");
    printer->Indent();
    for (int i = 0; i < canonical_values_.size(); i++) {
      const string constant_name =
          RenameJavaKeywords(canonical_values_[i]->name());
      if (use_shell_class) {
        printer->Print("$classname$.$name$,\n",
          "classname", classname,
          "name", constant_name);
      } else {
        printer->Print("$name$,\n", "name", constant_name);
      }
    }
    printer->Outdent();
    printer->Print("})\n");
  }
  if (use_shell_class || use_intdef) {
    printer->Print(
      "public $at_for_intdef$interface $classname$ {\n",
      "classname", classname,
      "at_for_intdef", use_intdef ? "@" : "");
    if (use_shell_class) {
        printer->Indent();
    } else {
        printer->Print("}\n\n");
    }
  }

  // Canonical values
  for (int i = 0; i < canonical_values_.size(); i++) {
    printer->Print(
      "public static final int $name$ = $canonical_value$;\n",
      "name", RenameJavaKeywords(canonical_values_[i]->name()),
      "canonical_value", SimpleItoa(canonical_values_[i]->number()));
  }

  // Aliases
  for (int i = 0; i < aliases_.size(); i++) {
    printer->Print(
      "public static final int $name$ = $canonical_name$;\n",
      "name", RenameJavaKeywords(aliases_[i].value->name()),
      "canonical_name", RenameJavaKeywords(aliases_[i].canonical_value->name()));
  }

  // End of container interface
  if (use_shell_class) {
    printer->Outdent();
    printer->Print("}\n");
  }
}